

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

int Ssw_ManSetConstrPhases_(Aig_Man_t *p,int nFrames,Vec_Int_t **pvInits)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  lit lVar3;
  Cnf_Dat_t *p_01;
  sat_solver *s;
  Vec_Int_t *p_02;
  Aig_Obj_t *pAVar4;
  int *piVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  int nRegs;
  int RetValue;
  int iVar;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Dat_t *pCnf;
  sat_solver *pSat;
  Vec_Int_t *vLits;
  Vec_Int_t **pvInits_local;
  int nFrames_local;
  Aig_Man_t *p_local;
  
  if (pvInits != (Vec_Int_t **)0x0) {
    *pvInits = (Vec_Int_t *)0x0;
  }
  if (0 < p->nConstrs) {
    iVar2 = p->nRegs;
    p->nRegs = 0;
    iVar1 = Aig_ManCoNum(p);
    p_01 = Cnf_Derive(p,iVar1);
    p->nRegs = iVar2;
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p_01,nFrames,0);
    if (s->size != nFrames * p_01->nVars) {
      __assert_fail("pSat->size == nFrames * pCnf->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                    ,0xac,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
    }
    p_02 = Vec_IntAlloc(100);
    for (iVar = 0; iVar2 = Saig_ManRegNum(p), iVar < iVar2; iVar = iVar + 1) {
      p_00 = p->vCis;
      iVar2 = Saig_ManPiNum(p);
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar + iVar2);
      piVar5 = p_01->pVarNums;
      iVar2 = Aig_ObjId(pAVar4);
      if (piVar5[iVar2] < 0) {
        __assert_fail("pCnf->pVarNums[Aig_ObjId(pObj)] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                      ,0xb1,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
      }
      piVar5 = p_01->pVarNums;
      iVar2 = Aig_ObjId(pAVar4);
      lVar3 = toLitCond(piVar5[iVar2],1);
      Vec_IntPush(p_02,lVar3);
    }
    RetValue = 0;
    do {
      if (nFrames <= RetValue) {
        piVar5 = Vec_IntArray(p_02);
        piVar6 = Vec_IntArray(p_02);
        iVar2 = Vec_IntSize(p_02);
        iVar2 = sat_solver_solve(s,piVar5,piVar6 + iVar2,1000000,0,0,0);
        if ((iVar2 == 1) && (pvInits != (Vec_Int_t **)0x0)) {
          pVVar7 = Vec_IntAlloc(1000);
          *pvInits = pVVar7;
          for (RetValue = 0; RetValue < nFrames; RetValue = RetValue + 1) {
            for (iVar = 0; iVar1 = Saig_ManPiNum(p), iVar < iVar1; iVar = iVar + 1) {
              pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar);
              piVar5 = p_01->pVarNums;
              iVar1 = Aig_ObjId(pAVar4);
              pVVar7 = *pvInits;
              iVar1 = sat_solver_var_value(s,piVar5[iVar1] + p_01->nVars * RetValue);
              Vec_IntPush(pVVar7,iVar1);
            }
          }
        }
        sat_solver_delete(s);
        Vec_IntFree(p_02);
        Cnf_DataFree(p_01);
        if (iVar2 == -1) {
          p_local._4_4_ = 1;
        }
        else if (iVar2 == 1) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = -1;
        }
        return p_local._4_4_;
      }
      for (iVar = 0; iVar2 = Saig_ManPoNum(p), iVar < iVar2; iVar = iVar + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar);
        iVar2 = Saig_ManPoNum(p);
        iVar1 = Saig_ManConstrNum(p);
        if (iVar2 - iVar1 <= iVar) {
          piVar5 = p_01->pVarNums;
          iVar2 = Aig_ObjId(pAVar4);
          if (piVar5[iVar2] < 0) {
            __assert_fail("pCnf->pVarNums[Aig_ObjId(pObj)] >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                          ,0xba,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
          }
          piVar5 = p_01->pVarNums;
          iVar2 = Aig_ObjId(pAVar4);
          lVar3 = toLitCond(piVar5[iVar2] + p_01->nVars * RetValue,1);
          Vec_IntPush(p_02,lVar3);
        }
      }
      RetValue = RetValue + 1;
    } while( true );
  }
  __assert_fail("p->nConstrs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswConstr.c"
                ,0xa5,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
}

Assistant:

int Ssw_ManSetConstrPhases_( Aig_Man_t * p, int nFrames, Vec_Int_t ** pvInits )
{
    Vec_Int_t * vLits;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, f, iVar, RetValue, nRegs;
    if ( pvInits )
        *pvInits = NULL;
    assert( p->nConstrs > 0 );
    // create CNF
    nRegs = p->nRegs; p->nRegs = 0;
    pCnf = Cnf_Derive( p, Aig_ManCoNum(p) );
    p->nRegs = nRegs;
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames, 0 );
    assert( pSat->size == nFrames * pCnf->nVars );
    // collect constraint literals
    vLits = Vec_IntAlloc( 100 );
    Saig_ManForEachLo( p, pObj, i )
    {
        assert( pCnf->pVarNums[Aig_ObjId(pObj)] >= 0 );
        Vec_IntPush( vLits, toLitCond(pCnf->pVarNums[Aig_ObjId(pObj)], 1) );
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                continue;
            assert( pCnf->pVarNums[Aig_ObjId(pObj)] >= 0 );
            iVar = pCnf->pVarNums[Aig_ObjId(pObj)] + pCnf->nVars*f;
            Vec_IntPush( vLits, toLitCond(iVar, 1) );
        }
    }
    RetValue = sat_solver_solve( pSat, (int *)Vec_IntArray(vLits),
        (int *)Vec_IntArray(vLits) + Vec_IntSize(vLits),
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_True && pvInits )
    {
        *pvInits = Vec_IntAlloc( 1000 );
        for ( f = 0; f < nFrames; f++ )
        {
            Saig_ManForEachPi( p, pObj, i )
            {
                iVar = pCnf->pVarNums[Aig_ObjId(pObj)] + pCnf->nVars*f;
                Vec_IntPush( *pvInits, sat_solver_var_value(pSat, iVar) );
            }
        }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    Cnf_DataFree( pCnf );
    if ( RetValue == l_False )
        return 1;
    if ( RetValue == l_True )
        return 0;
    return -1;
}